

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall SimpleASTNode::eval(SimpleASTNode *this,int level)

{
  list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_> *plVar1;
  size_t *psVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<SimpleASTNode> *psVar4;
  uint __val;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  iterator iVar9;
  string *psVar10;
  ostream *poVar11;
  _Elt_pointer psVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  uint uVar14;
  ulong uVar15;
  size_type sVar16;
  undefined4 in_register_00000034;
  char *pcVar17;
  uint __len;
  uint uVar18;
  list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_> *__range1;
  element_type *peVar19;
  _List_node_base *p_Var20;
  undefined1 auStack_c8 [8];
  stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
  tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  undefined8 local_60;
  ASTNodeType local_54;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined1 auStack_48 [8];
  Ptr result;
  
  local_60 = CONCAT44(in_register_00000034,level);
  plVar1 = &this->m_childList;
  p_Var20 = (this->m_childList).
            super__List_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (level == 0) {
    if (p_Var20 == (_List_node_base *)plVar1) {
      if (this->m_type == INT_LITERAL) {
        pcVar17 = (this->m_text)._M_dataplus._M_p;
        sVar16 = (this->m_text)._M_string_length;
        poVar11 = (ostream *)&std::cout;
      }
      else {
        if (this->m_type != ID) {
          return;
        }
        iVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&m_varMap_abi_cxx11_._M_h,&this->m_text);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Undefined var \'",0xf);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(this->m_text)._M_dataplus._M_p,
                               (this->m_text)._M_string_length);
          pcVar17 = "\'";
          sVar16 = 1;
        }
        else {
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(this->m_text)._M_dataplus._M_p,
                               (this->m_text)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
          pcVar17 = *(char **)((long)iVar9.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                     ._M_cur + 0x28);
          sVar16 = *(size_type *)
                    ((long)iVar9.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                           ._M_cur + 0x30);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar17,sVar16);
      return;
    }
  }
  else if (p_Var20 == (_List_node_base *)plVar1) {
    return;
  }
  if (p_Var20 != (_List_node_base *)plVar1) {
    do {
      eval((SimpleASTNode *)p_Var20[1]._M_next,level + 1);
      if (*(int *)&(p_Var20[1]._M_next)->_M_next - 1U < 2) {
        std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ::push_back(&m_evalStack.c,(value_type *)(p_Var20 + 1));
      }
      p_Var20 = p_Var20->_M_next;
    } while (p_Var20 != (_List_node_base *)plVar1);
  }
  if (this->m_type - ADDITIVE_EXP < 2) {
    iVar6 = 0x10e3d8;
    psVar12 = m_evalStack.c.
              super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar12 = m_evalStack.c.
                super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar3 = psVar12[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var13 = psVar12[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
      }
    }
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    pop_back(&m_evalStack.c);
    psVar12 = m_evalStack.c.
              super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar12 = m_evalStack.c.
                super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar19 = psVar12[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50 = psVar12[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_50->_M_use_count = local_50->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_50->_M_use_count = local_50->_M_use_count + 1;
      }
    }
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    pop_back(&m_evalStack.c);
    if (peVar19->m_type == INT_LITERAL) {
      psVar10 = &peVar19->m_text;
      peVar19 = (element_type *)psVar10;
LAB_001081e0:
      iVar6 = atoi((psVar10->_M_dataplus)._M_p);
    }
    else if (peVar19->m_type == ID) {
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&m_varMap_abi_cxx11_._M_h,&peVar19->m_text);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Undefined var \'",0xf);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(peVar19->m_text)._M_dataplus._M_p,
                             (peVar19->m_text)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'",1);
        this_00 = local_50;
        goto joined_r0x001083b8;
      }
      psVar10 = (string *)
                ((long)iVar9.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 0x28);
      goto LAB_001081e0;
    }
    iVar7 = (int)peVar19;
    if (peVar3->m_type == INT_LITERAL) {
      psVar10 = &peVar3->m_text;
LAB_0010821d:
      iVar7 = atoi((psVar10->_M_dataplus)._M_p);
    }
    else if (peVar3->m_type == ID) {
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&m_varMap_abi_cxx11_._M_h,&peVar3->m_text);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Undefined var \'",0xf);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(peVar3->m_text)._M_dataplus._M_p,
                             (peVar3->m_text)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'",1);
        this_00 = local_50;
        goto joined_r0x001083b8;
      }
      psVar10 = (string *)
                ((long)iVar9.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 0x28);
      goto LAB_0010821d;
    }
    auStack_48 = (undefined1  [8])0x0;
    result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    psVar10 = &this->m_text;
    iVar8 = std::__cxx11::string::compare((char *)psVar10);
    if (iVar8 == 0) {
      uVar18 = iVar7 * iVar6;
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)psVar10);
      if (iVar8 == 0) {
        uVar18 = iVar6 / iVar7;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)psVar10);
        if (iVar8 == 0) {
          uVar18 = iVar7 + iVar6;
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)psVar10);
          uVar18 = 0;
          if (iVar8 == 0) {
            uVar18 = iVar6 - iVar7;
          }
        }
      }
    }
    local_54 = INT_LITERAL;
    __val = -uVar18;
    if (0 < (int)uVar18) {
      __val = uVar18;
    }
    __len = 1;
    if (9 < __val) {
      uVar15 = (ulong)__val;
      uVar5 = 4;
      do {
        __len = uVar5;
        uVar14 = (uint)uVar15;
        if (uVar14 < 100) {
          __len = __len - 2;
          goto LAB_00108479;
        }
        if (uVar14 < 1000) {
          __len = __len - 1;
          goto LAB_00108479;
        }
        if (uVar14 < 10000) goto LAB_00108479;
        uVar15 = uVar15 / 10000;
        uVar5 = __len + 4;
      } while (99999 < uVar14);
      __len = __len + 1;
    }
LAB_00108479:
    psVar2 = &tmp.c.
              super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size;
    auStack_c8 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_construct((ulong)auStack_c8,(char)__len - (char)((int)uVar18 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)auStack_c8 + (ulong)(uVar18 >> 0x1f)),__len,__val);
    tmp.c.
    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SimpleASTNode,std::allocator<SimpleASTNode>,ASTNodeType_const&,std::__cxx11::string_const&>
              (a_Stack_70,
               (SimpleASTNode **)
               &tmp.c.
                super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node,
               (allocator<SimpleASTNode> *)
               ((long)&result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7),&local_54,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_c8);
    peVar3 = result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)a_Stack_70[0]._M_pi;
    auStack_48 = (undefined1  [8])
                 tmp.c.
                 super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node;
    tmp.c.
    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((peVar3 != (element_type *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3),
       (element_type *)a_Stack_70[0]._M_pi != (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_70[0]._M_pi);
    }
    if (auStack_c8 != (undefined1  [8])psVar2) {
      operator_delete((void *)auStack_c8);
    }
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    push_back(&m_evalStack.c,(value_type *)auStack_48);
    this_00 = local_50;
    if (result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      this_00 = local_50;
    }
  }
  else {
    if (this->m_type != ASSIGMENT) goto LAB_0010854b;
    psVar12 = m_evalStack.c.
              super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar12 = m_evalStack.c.
                super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar3 = psVar12[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var13 = psVar12[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
      }
    }
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    pop_back(&m_evalStack.c);
    psVar12 = m_evalStack.c.
              super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar12 = m_evalStack.c.
                super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar19 = psVar12[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = psVar12[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    pop_back(&m_evalStack.c);
    if (peVar19->m_type == ID) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_c8,&peVar19->m_text,&peVar3->m_text);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&m_varMap_abi_cxx11_);
      if (tmp.c.
          super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_first !=
          (_Elt_pointer)
          &tmp.c.
           super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node) {
        operator_delete(tmp.c.
                        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first);
      }
      if (auStack_c8 !=
          (undefined1  [8])
          &tmp.c.
           super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size) {
        operator_delete((void *)auStack_c8);
      }
    }
  }
joined_r0x001083b8:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
  }
LAB_0010854b:
  if ((int)local_60 == 0) {
    tmp.c.
    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    tmp.c.
    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    tmp.c.
    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    tmp.c.
    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    tmp.c.
    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    tmp.c.
    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    tmp.c.
    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 0;
    tmp.c.
    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    auStack_c8 = (undefined1  [8])0x0;
    tmp.c.
    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    std::
    _Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    _M_initialize_map((_Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                       *)auStack_c8,0);
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        psVar12 = m_evalStack.c.
                  super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (m_evalStack.c.
            super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            m_evalStack.c.
            super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar12 = m_evalStack.c.
                    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        auStack_48 = (undefined1  [8])
                     psVar12[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
        result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             psVar12[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->m_text)._M_dataplus._M_p =
                 *(int *)&((result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_text)._M_dataplus._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&((result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->m_text)._M_dataplus._M_p =
                 *(int *)&((result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_text)._M_dataplus._M_p + 1;
          }
        }
        std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ::pop_back(&m_evalStack.c);
        std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ::push_back((deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                     *)auStack_c8,(value_type *)auStack_48);
        if (result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      } while (m_evalStack.c.
               super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               m_evalStack.c.
               super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    if (tmp.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node !=
        (_Map_pointer)
        tmp.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size) {
      do {
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  tmp.c.
                  super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        if ((_Elt_pointer)
            tmp.c.
            super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node ==
            tmp.c.
            super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          p_Var13 = tmp.c.
                    super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].
                    super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    + 0x20;
        }
        psVar4 = (shared_ptr<SimpleASTNode> *)p_Var13[-1]._vptr__Sp_counted_base;
        p_Var13 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var13[-1]._M_use_count;
        if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
          }
        }
        std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ::pop_back((deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                    *)auStack_c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   (char *)(psVar4->super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi,
                   (long)psVar4[1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
        if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
        }
      } while (tmp.c.
               super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node !=
               (_Map_pointer)
               tmp.c.
               super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
               ._M_impl.super__Deque_impl_data._M_map_size);
    }
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    ~deque((deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            *)auStack_c8);
  }
  return;
}

Assistant:

void SimpleASTNode::eval(int level)
{
    //Recursive ending condition
    if (level && m_childList.empty())
        return;
    else if (!level && m_childList.empty()) {
        //std::cout << "here";
        if (m_type == ASTNodeType::ID) {
            auto search = m_varMap.find(m_text);
            if (search != m_varMap.end()) {
                std::cout << m_text << ": " << search->second;
            } else {
                std::cout << "Undefined var \'" << m_text << "\'";
            }            
        } else if (m_type == ASTNodeType::INT_LITERAL) {
            std::cout << m_text;
        }
        return;
    }
    for (auto& item : m_childList) {
        item->eval(level + 1);
        if (item->m_type == ASTNodeType::ID || item->m_type == ASTNodeType::INT_LITERAL) {
            m_evalStack.push(item);
        }
    }
    switch (m_type) {
        case ASTNodeType::DECLARATION:
            break;
        case ASTNodeType::MULTIL_EXP:
        case ASTNodeType::ADDITIVE_EXP:
        {
            SimpleASTNode::Ptr child2 = m_evalStack.top();
            m_evalStack.pop();
            SimpleASTNode::Ptr child1 = m_evalStack.top();
            m_evalStack.pop();
            int iChild1;
            int iChild2;
            if (child1->m_type == ASTNodeType::ID) {
                auto search = m_varMap.find(child1->m_text);
                if (search != m_varMap.end()) {
                    iChild1 = atoi((search->second).c_str());
                } else {
                    std::cout << "Undefined var \'" << child1->m_text << "\'";
                    break;
                }
            } else if (child1->m_type == ASTNodeType::INT_LITERAL) {
                iChild1 = atoi((child1->m_text).c_str());
            }
            if (child2->m_type == ASTNodeType::ID) {
                auto search = m_varMap.find(child2->m_text);
                if (search != m_varMap.end()) {
                    iChild2 = atoi((search->second).c_str());
                } else {
                    std::cout << "Undefined var \'" << child2->m_text << "\'";
                    break;
                }
            } else if (child2->m_type == ASTNodeType::INT_LITERAL) {
                iChild2 = atoi((child2->m_text).c_str());
            }
            int iResult = 0;
            SimpleASTNode::Ptr result;
            if (!m_text.compare({"*"})) {
                iResult = iChild1 * iChild2;
            } else if (!m_text.compare({"/"})) {
                iResult = iChild1 / iChild2;
            } else if (!m_text.compare({"+"})) {
                iResult = iChild1 + iChild2;
            } else if (!m_text.compare({"-"})) {
                iResult = iChild1 - iChild2;
            }
            result = SimpleASTNode::create(ASTNodeType::INT_LITERAL, std::to_string(iResult));
            m_evalStack.push(result);            
        }
            break;      
        case ASTNodeType::ASSIGMENT:
        {
            SimpleASTNode::Ptr child2 = m_evalStack.top();
            m_evalStack.pop();
            SimpleASTNode::Ptr child1 = m_evalStack.top();
            m_evalStack.pop();
            if (child1->m_type == ASTNodeType::ID) {
                m_varMap.insert({child1->m_text, child2->m_text});
            }
        }   
            break;
        default:
            break;     
    }

    //Handle the final results
    if (!level) {
        std::stack<SimpleASTNode::Ptr> tmp;
        while (!m_evalStack.empty()) {
            SimpleASTNode::Ptr node = m_evalStack.top();
            m_evalStack.pop();
            tmp.push(node);
        }
        while (!tmp.empty()) {
            SimpleASTNode::Ptr node = tmp.top();
            tmp.pop();
            std::cout << node->m_text;
        }
    }
}